

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void mi_vfprintf_thread(mi_output_fun *out,void *arg,char *prefix,char *fmt,__va_list_tag *args)

{
  _Bool _Var1;
  size_t sVar2;
  mi_threadid_t mVar3;
  char tprefix [64];
  char acStack_68 [72];
  
  if (out != (mi_output_fun *)0x0) {
    sVar2 = _mi_strnlen((char *)out,0x21);
    if (sVar2 < 0x21) {
      _Var1 = _mi_is_main_thread();
      if (!_Var1) {
        mVar3 = _mi_thread_id();
        _mi_snprintf(acStack_68,0x40,"%sthread 0x%tx: ",out,mVar3);
        mi_vfprintf((mi_output_fun *)0x0,(void *)0x0,acStack_68,(char *)arg,(__va_list_tag *)prefix)
        ;
        return;
      }
    }
  }
  mi_vfprintf((mi_output_fun *)0x0,(void *)0x0,(char *)out,(char *)arg,(__va_list_tag *)prefix);
  return;
}

Assistant:

static void mi_vfprintf_thread(mi_output_fun* out, void* arg, const char* prefix, const char* fmt, va_list args) {
  if (prefix != NULL && _mi_strnlen(prefix,33) <= 32 && !_mi_is_main_thread()) {
    char tprefix[64];
    _mi_snprintf(tprefix, sizeof(tprefix), "%sthread 0x%tx: ", prefix, (uintptr_t)_mi_thread_id());
    mi_vfprintf(out, arg, tprefix, fmt, args);
  }
  else {
    mi_vfprintf(out, arg, prefix, fmt, args);
  }
}